

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

void Abc_NtkDfsReverseNodes_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int nCapMin;
  Abc_Obj_t *Entry;
  void *pvVar4;
  int iVar5;
  long lVar6;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 6) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x105,"void Abc_NtkDfsReverseNodes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  iVar2 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar2 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    uVar3 = *(uint *)&pNode->field_0x14 & 0xf;
    if (uVar3 - 5 < 0xfffffffe) {
      if (uVar3 == 7) {
        Entry = Abc_ObjFanout0Ntk(pNode);
        for (lVar6 = 0; lVar6 < (Entry->vFanouts).nSize; lVar6 = lVar6 + 1) {
          Abc_NtkDfsReverseNodes_rec
                    ((Abc_Obj_t *)Entry->pNtk->vObjs->pArray[(Entry->vFanouts).pArray[lVar6]],vNodes
                    );
        }
        uVar3 = *(uint *)&Entry->field_0x14 >> 0xc;
        iVar2 = vNodes->nSize;
        if (iVar2 <= (int)uVar3) {
          iVar1 = vNodes->nCap * 2;
          iVar5 = (int)((ulong)uVar3 + 1);
          nCapMin = iVar5;
          if ((iVar1 <= (int)uVar3) || (nCapMin = iVar1, vNodes->nCap <= (int)uVar3)) {
            Vec_PtrGrow(vNodes,nCapMin);
            iVar2 = vNodes->nSize;
          }
          for (lVar6 = (long)iVar2; lVar6 < (long)((ulong)uVar3 + 1); lVar6 = lVar6 + 1) {
            vNodes->pArray[lVar6] = (void *)0x0;
          }
          vNodes->nSize = iVar5;
          uVar3 = *(uint *)&Entry->field_0x14 >> 0xc;
        }
        pvVar4 = Vec_PtrEntry(vNodes,uVar3);
        (Entry->field_6).pTemp = pvVar4;
        Vec_PtrWriteEntry(vNodes,*(uint *)&Entry->field_0x14 >> 0xc,Entry);
        return;
      }
      __assert_fail("Abc_ObjIsNode( pNode )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                    ,0x10e,"void Abc_NtkDfsReverseNodes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsReverseNodes_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( !Abc_ObjIsNet(pNode) );
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // skip the CI
    if ( Abc_ObjIsCo(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    pNode = Abc_ObjFanout0Ntk(pNode);
    Abc_ObjForEachFanout( pNode, pFanout, i )
        Abc_NtkDfsReverseNodes_rec( pFanout, vNodes );
    // add the node after the fanins have been added
//    Vec_PtrPush( vNodes, pNode );
    Vec_PtrFillExtra( vNodes, pNode->Level + 1, NULL );
    pNode->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vNodes, pNode->Level );
    Vec_PtrWriteEntry( vNodes, pNode->Level, pNode );
}